

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::AddDebugValueForVariable
          (DebugInfoManager *this,Instruction *scope_and_line,uint32_t variable_id,uint32_t value_id
          ,Instruction *insert_pos)

{
  iterator iVar1;
  Instruction *pIVar2;
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  uint32_t local_3c;
  Instruction *local_38;
  
  local_3c = variable_id;
  local_38 = insert_pos;
  if (scope_and_line == (Instruction *)0x0) {
    __assert_fail("scope_and_line != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x235,
                  "bool spvtools::opt::analysis::DebugInfoManager::AddDebugValueForVariable(Instruction *, uint32_t, uint32_t, Instruction *)"
                 );
  }
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->var_id_to_dbg_decl_)._M_h,&local_3c);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    p_Var3 = *(_Rb_tree_node_base **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                     ._M_cur + 0x28);
    if (p_Var3 != (_Rb_tree_node_base *)
                  ((long)iVar1.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                         ._M_cur + 0x18)) {
      bVar4 = false;
      do {
        pIVar2 = local_38;
        do {
          pIVar2 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
            pIVar2 = (Instruction *)0x0;
          }
        } while ((pIVar2->opcode_ == OpVariable) || (pIVar2->opcode_ == OpPhi));
        pIVar2 = AddDebugValueForDecl
                           (this,*(Instruction **)(p_Var3 + 1),value_id,pIVar2,scope_and_line);
        bVar4 = (bool)(bVar4 | pIVar2 != (Instruction *)0x0);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != (_Rb_tree_node_base *)
                         ((long)iVar1.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                                ._M_cur + 0x18));
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool DebugInfoManager::AddDebugValueForVariable(Instruction* scope_and_line,
                                                uint32_t variable_id,
                                                uint32_t value_id,
                                                Instruction* insert_pos) {
  assert(scope_and_line != nullptr);

  auto dbg_decl_itr = var_id_to_dbg_decl_.find(variable_id);
  if (dbg_decl_itr == var_id_to_dbg_decl_.end()) return false;

  bool modified = false;
  for (auto* dbg_decl_or_val : dbg_decl_itr->second) {
    // Avoid inserting the new DebugValue between OpPhi or OpVariable
    // instructions.
    Instruction* insert_before = insert_pos->NextNode();
    while (insert_before->opcode() == spv::Op::OpPhi ||
           insert_before->opcode() == spv::Op::OpVariable) {
      insert_before = insert_before->NextNode();
    }
    modified |= AddDebugValueForDecl(dbg_decl_or_val, value_id, insert_before,
                                     scope_and_line) != nullptr;
  }
  return modified;
}